

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_atanh_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint64_t uVar4;
  uint uVar5;
  uint uVar6;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 fVar7;
  floatx80 fVar8;
  floatx80 fVar9;
  
  fVar7.low = a.low;
  uVar6 = a._8_4_;
  if (((~uVar6 & 0x7fff) == 0) &&
     (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)) {
    auVar3 = a._0_12_;
    fVar8._12_4_ = 0;
    fVar8.low = auVar3._0_8_;
    fVar8.high = auVar3._8_2_;
    fVar8._10_2_ = auVar3._10_2_;
    fVar7 = propagateFloatx80NaNOneArg(fVar8,status);
    return fVar7;
  }
  b._8_4_ = uVar6 & 0x7fff;
  uVar5 = uVar6 & 0x8000;
  if (fVar7.low != 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
    if (((uint)a.low._6_2_ | b._8_4_ << 0x10) < 0x3fff8000) {
      cVar1 = status->float_rounding_mode;
      cVar2 = status->floatx80_rounding_precision;
      status->float_rounding_mode = '\0';
      status->floatx80_rounding_precision = 'P';
      b.low = fVar7.low;
      b._12_4_ = 0;
      fVar7._8_4_ = b._8_4_;
      fVar7._12_4_ = 0;
      fVar8 = floatx80_add_m68k(fVar7,b,status);
      b_00._8_8_ = 0x3fff;
      b_00.low = 0x8000000000000000;
      a_00._8_4_ = uVar6 | 0xffff8000;
      a_00.low = fVar7.low;
      a_00._12_4_ = 0;
      fVar7 = floatx80_add_m68k(a_00,b_00,status);
      b_01._8_8_ = fVar7._8_8_ & 0xffffffff;
      b_01.low = fVar7.low;
      auVar3 = fVar8._0_12_;
      a_01._12_4_ = 0;
      a_01.low = auVar3._0_8_;
      a_01.high = auVar3._8_2_;
      a_01._10_2_ = auVar3._10_2_;
      fVar7 = floatx80_div_m68k(a_01,b_01,status);
      auVar3 = fVar7._0_12_;
      a_02._12_4_ = 0;
      a_02.low = auVar3._0_8_;
      a_02.high = auVar3._8_2_;
      a_02._10_2_ = auVar3._10_2_;
      fVar7 = floatx80_lognp1_m68k(a_02,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      b_02._8_4_ = uVar5 | 0x3ffe;
      b_02.low = 0x8000000000000000;
      b_02._12_4_ = 0;
      auVar3 = fVar7._0_12_;
      a_03._12_4_ = 0;
      a_03.low = auVar3._0_8_;
      a_03.high = auVar3._8_2_;
      a_03._10_2_ = auVar3._10_2_;
      fVar7 = floatx80_mul_m68k(a_03,b_02,status);
      uVar4 = fVar7.low;
      uVar5 = fVar7._8_4_;
      float_raise_m68k(' ',status);
      goto LAB_006f2b63;
    }
    if (fVar7.low != 0x8000000000000000 || b._8_4_ != 0x3fff) {
      float_raise_m68k('\x01',status);
      fVar7 = floatx80_default_nan_m68k(status);
      return fVar7;
    }
    float_raise_m68k('\x04',status);
    uVar5 = (uint)(ushort)((short)uVar5 + 0x7fff);
  }
  uVar4 = 0;
LAB_006f2b63:
  fVar9._8_4_ = uVar5;
  fVar9.low = uVar4;
  fVar9._12_4_ = 0;
  return fVar9;
}

Assistant:

floatx80 floatx80_atanh(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact;
    floatx80 fp0, fp1, fp2, one;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF && (uint64_t) (aSig << 1)) {
        return propagateFloatx80NaNOneArg(a, status);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(aSign, 0, 0);
    }

    compact = floatx80_make_compact(aExp, aSig);

    if (compact >= 0x3FFF8000) { /* |X| >= 1 */
        if (aExp == one_exp && aSig == one_sig) { /* |X| == 1 */
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(aSign, floatx80_infinity.high,
                                floatx80_infinity.low);
        } else { /* |X| > 1 */
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
    } /* |X| < 1 */

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    one = packFloatx80(0, one_exp, one_sig);
    fp2 = packFloatx80(aSign, 0x3FFE, one_sig); /* SIGN(X) * (1/2) */
    fp0 = packFloatx80(0, aExp, aSig); /* Y = |X| */
    fp1 = packFloatx80(1, aExp, aSig); /* -Y */
    fp0 = floatx80_add(fp0, fp0, status); /* 2Y */
    fp1 = floatx80_add(fp1, one, status); /* 1-Y */
    fp0 = floatx80_div(fp0, fp1, status); /* Z = 2Y/(1-Y) */
    fp0 = floatx80_lognp1(fp0, status); /* LOG1P(Z) */

    status->float_rounding_mode = user_rnd_mode;
    status->floatx80_rounding_precision = user_rnd_prec;

    a = floatx80_mul(fp0, fp2,
                     status); /* ATANH(X) = SIGN(X) * (1/2) * LOG1P(Z) */

    float_raise(float_flag_inexact, status);

    return a;
}